

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O2

uint64 mkvmuxer::WriteVoidElement(IMkvWriter *writer,uint64 size)

{
  uint uVar1;
  int iVar2;
  int32 iVar3;
  int iVar4;
  ulong in_RAX;
  uint64 uVar5;
  int extraout_var;
  int extraout_var_00;
  int iVar6;
  uint64 value_00;
  ulong uStack_38;
  uint8 value;
  
  if (writer != (IMkvWriter *)0x0) {
    uStack_38 = in_RAX;
    uVar1 = GetCodedUIntSize(size - 1);
    value_00 = (size - 1) - (ulong)uVar1;
    uVar5 = EbmlMasterElementSize(0xec,value_00);
    if (uVar5 + value_00 == size) {
      iVar2 = (*writer->_vptr_IMkvWriter[1])(writer);
      if ((-1 < extraout_var) && (iVar3 = WriteID(writer,0xec), iVar3 == 0)) {
        iVar3 = WriteUInt(writer,value_00);
        if (iVar3 != 0) {
          return 0;
        }
        uStack_38 = uStack_38 & 0xffffffffffffff;
        iVar6 = (int)value_00;
        if (iVar6 < 1) {
          iVar6 = 0;
        }
        iVar6 = iVar6 + 1;
        while( true ) {
          iVar6 = iVar6 + -1;
          if (iVar6 == 0) break;
          iVar4 = (**writer->_vptr_IMkvWriter)(writer,&value,1);
          if (iVar4 != 0) {
            return 0;
          }
        }
        iVar6 = (*writer->_vptr_IMkvWriter[1])(writer);
        if (CONCAT44(extraout_var_00,iVar6) - CONCAT44(extraout_var,iVar2) != size) {
          size = 0;
        }
        if (-1 < extraout_var_00) {
          return size;
        }
        return 0;
      }
    }
  }
  return 0;
}

Assistant:

uint64 WriteVoidElement(IMkvWriter* writer, uint64 size) {
  if (!writer)
    return false;

  // Subtract one for the void ID and the coded size.
  uint64 void_entry_size = size - 1 - GetCodedUIntSize(size - 1);
  uint64 void_size = EbmlMasterElementSize(libwebm::kMkvVoid, void_entry_size) +
                     void_entry_size;

  if (void_size != size)
    return 0;

  const int64 payload_position = writer->Position();
  if (payload_position < 0)
    return 0;

  if (WriteID(writer, libwebm::kMkvVoid))
    return 0;

  if (WriteUInt(writer, void_entry_size))
    return 0;

  const uint8 value = 0;
  for (int32 i = 0; i < static_cast<int32>(void_entry_size); ++i) {
    if (writer->Write(&value, 1))
      return 0;
  }

  const int64 stop_position = writer->Position();
  if (stop_position < 0 ||
      stop_position - payload_position != static_cast<int64>(void_size))
    return 0;

  return void_size;
}